

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyMan.c
# Opt level: O2

Ivy_Man_t * Ivy_ManDup(Ivy_Man_t *p)

{
  uint uVar1;
  Ivy_Man_t *p_00;
  int iVar2;
  Vec_Int_t *p_01;
  Ivy_Man_t *p_02;
  void *pvVar3;
  Ivy_Obj_t *pIVar4;
  Ivy_Obj_t *pIVar5;
  Ivy_Obj_t *p1;
  int iVar6;
  Vec_Int_t *vLatches;
  Vec_Int_t *local_40;
  Ivy_Man_t *local_38;
  
  p_01 = Ivy_ManDfsSeq(p,&local_40);
  p_02 = Ivy_ManStart();
  p->pConst1->pEquiv = p_02->pConst1;
  for (iVar6 = 0; iVar6 < p->vPis->nSize; iVar6 = iVar6 + 1) {
    pvVar3 = Vec_PtrEntry(p->vPis,iVar6);
    pIVar4 = Ivy_ObjCreatePi(p_02);
    *(Ivy_Obj_t **)((long)pvVar3 + 0x48) = pIVar4;
  }
  for (iVar6 = 0; iVar6 < local_40->nSize; iVar6 = iVar6 + 1) {
    iVar2 = Vec_IntEntry(local_40,iVar6);
    pIVar4 = Ivy_ManObj(p,iVar2);
    if (pIVar4 == (Ivy_Obj_t *)0x0) break;
    pIVar5 = Ivy_ObjCreatePi(p_02);
    pIVar4->pEquiv = pIVar5;
  }
  local_38 = p;
  for (iVar6 = 0; p_00 = local_38, iVar6 < p_01->nSize; iVar6 = iVar6 + 1) {
    iVar2 = Vec_IntEntry(p_01,iVar6);
    pIVar4 = Ivy_ManObj(p_00,iVar2);
    if (pIVar4 == (Ivy_Obj_t *)0x0) break;
    uVar1 = *(uint *)&pIVar4->field_0x8;
    pIVar5 = Ivy_ObjChild0Equiv(pIVar4);
    if ((uVar1 & 0xf) != 7) {
      p1 = Ivy_ObjChild1Equiv(pIVar4);
      pIVar5 = Ivy_And(p_02,pIVar5,p1);
    }
    pIVar4->pEquiv = pIVar5;
  }
  for (iVar6 = 0; iVar6 < p_00->vPos->nSize; iVar6 = iVar6 + 1) {
    pIVar4 = (Ivy_Obj_t *)Vec_PtrEntry(p_00->vPos,iVar6);
    pIVar4 = Ivy_ObjChild0Equiv(pIVar4);
    Ivy_ObjCreatePo(p_02,pIVar4);
  }
  for (iVar6 = 0; iVar6 < local_40->nSize; iVar6 = iVar6 + 1) {
    iVar2 = Vec_IntEntry(local_40,iVar6);
    pIVar4 = Ivy_ManObj(p_00,iVar2);
    if (pIVar4 == (Ivy_Obj_t *)0x0) break;
    if (((ulong)pIVar4->pFanin0 & 1) != 0) {
      __assert_fail("!Ivy_ObjFaninC0(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyMan.c"
                    ,0x8b,"Ivy_Man_t *Ivy_ManDup(Ivy_Man_t *)");
    }
    *(uint *)&pIVar4->pEquiv->field_0x8 = *(uint *)&pIVar4->pEquiv->field_0x8 & 0xfffffff0 | 4;
    *(uint *)&pIVar4->pEquiv->field_0x8 =
         *(uint *)&pIVar4->pEquiv->field_0x8 & 0xfffff9ff | *(uint *)&pIVar4->field_0x8 & 0x600;
    pIVar5 = pIVar4->pEquiv;
    pIVar4 = Ivy_ObjChild0Equiv(pIVar4);
    Ivy_ObjConnect(p_02,pIVar5,pIVar4,(Ivy_Obj_t *)0x0);
  }
  Vec_PtrShrink(p_02->vPis,p_00->nObjs[1]);
  p_02->nObjs[1] = p_02->nObjs[1] - p_00->nObjs[4];
  p_02->nObjs[4] = p_02->nObjs[4] + p_00->nObjs[4];
  Vec_IntFree(p_01);
  Vec_IntFree(local_40);
  if (p_00->nObjs[6] + p_00->nObjs[5] != p_02->nObjs[6] + p_02->nObjs[5]) {
    __assert_fail("Ivy_ManNodeNum(p) == Ivy_ManNodeNum(pNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyMan.c"
                  ,0x99,"Ivy_Man_t *Ivy_ManDup(Ivy_Man_t *)");
  }
  if (p_00->nObjs[4] == p_02->nObjs[4]) {
    iVar6 = Ivy_ManCheck(p_02);
    if (iVar6 == 0) {
      puts("Ivy_ManMakeSeq(): The check has failed.");
    }
    return p_02;
  }
  __assert_fail("Ivy_ManLatchNum(p) == Ivy_ManLatchNum(pNew)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyMan.c"
                ,0x9a,"Ivy_Man_t *Ivy_ManDup(Ivy_Man_t *)");
}

Assistant:

Ivy_Man_t * Ivy_ManDup( Ivy_Man_t * p )
{
    Vec_Int_t * vNodes, * vLatches;
    Ivy_Man_t * pNew;
    Ivy_Obj_t * pObj;
    int i;
    // collect latches and nodes in the DFS order
    vNodes = Ivy_ManDfsSeq( p, &vLatches );
    // create the new manager
    pNew = Ivy_ManStart();
    // create the PIs
    Ivy_ManConst1(p)->pEquiv = Ivy_ManConst1(pNew);
    Ivy_ManForEachPi( p, pObj, i )
        pObj->pEquiv = Ivy_ObjCreatePi(pNew);
    // create the fake PIs for latches
    Ivy_ManForEachNodeVec( p, vLatches, pObj, i )
        pObj->pEquiv = Ivy_ObjCreatePi(pNew);
    // duplicate internal nodes
    Ivy_ManForEachNodeVec( p, vNodes, pObj, i )
        if ( Ivy_ObjIsBuf(pObj) )
            pObj->pEquiv = Ivy_ObjChild0Equiv(pObj);
        else
            pObj->pEquiv = Ivy_And( pNew, Ivy_ObjChild0Equiv(pObj), Ivy_ObjChild1Equiv(pObj) );
    // add the POs
    Ivy_ManForEachPo( p, pObj, i )
        Ivy_ObjCreatePo( pNew, Ivy_ObjChild0Equiv(pObj) );
    // transform additional PI nodes into latches and connect them
    Ivy_ManForEachNodeVec( p, vLatches, pObj, i )
    {
        assert( !Ivy_ObjFaninC0(pObj) );
        pObj->pEquiv->Type = IVY_LATCH;
        pObj->pEquiv->Init = pObj->Init;
        Ivy_ObjConnect( pNew, pObj->pEquiv, Ivy_ObjChild0Equiv(pObj), NULL );
    }
    // shrink the arrays
    Vec_PtrShrink( pNew->vPis, Ivy_ManPiNum(p) );
    // update the counters of different objects
    pNew->nObjs[IVY_PI] -= Ivy_ManLatchNum(p);
    pNew->nObjs[IVY_LATCH] += Ivy_ManLatchNum(p);
    // free arrays
    Vec_IntFree( vNodes );
    Vec_IntFree( vLatches );
    // make sure structural hashing did not change anything
    assert( Ivy_ManNodeNum(p)  == Ivy_ManNodeNum(pNew) );
    assert( Ivy_ManLatchNum(p) == Ivy_ManLatchNum(pNew) );
    // check the resulting network
    if ( !Ivy_ManCheck(pNew) )
        printf( "Ivy_ManMakeSeq(): The check has failed.\n" );
    return pNew;
}